

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O1

ktx_uint32_t ktxTexture2_calcPostInflationLevelAlignment(ktxTexture2 *This)

{
  uint uVar1;
  uint a;
  uint32_t uVar2;
  
  if (KTX_SS_BASIS_LZ < This->supercompressionScheme) {
    if (This->vkFormat == 0) {
      a = 0x10;
    }
    else {
      uVar1 = (This->_protected->_formatSize).blockSizeInBits;
      a = uVar1 >> 3;
      if ((uVar1 & 0x18) != 0) {
        uVar2 = gcd(a,4);
        a = (a * 4) / uVar2;
      }
    }
    return a;
  }
  __assert_fail("This->supercompressionScheme != KTX_SS_NONE && This->supercompressionScheme != KTX_SS_BASIS_LZ"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/texture2.c"
                ,0x6d5,"ktx_uint32_t ktxTexture2_calcPostInflationLevelAlignment(ktxTexture2 *)");
}

Assistant:

ktx_uint32_t
ktxTexture2_calcPostInflationLevelAlignment(ktxTexture2* This)
{
    ktx_uint32_t alignment;

    // Should actually work for none supercompressed but don't want to
    // encourage use of it.
    assert(This->supercompressionScheme != KTX_SS_NONE && This->supercompressionScheme != KTX_SS_BASIS_LZ);

    if (This->vkFormat != VK_FORMAT_UNDEFINED)
        alignment = lcm4(This->_protected->_formatSize.blockSizeInBits / 8);
    else
        alignment = 16;

    return alignment;
}